

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O1

hpdata_t * duckdb_je_psset_pick_alloc(psset_t *psset,size_t size)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  hpdata_t *phVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  
  sVar2 = duckdb_je_sz_psz_quantize_ceil(size);
  if (sVar2 < 0x7000000000000001) {
    uVar8 = sVar2 - 1;
    if (uVar8 == 0) {
      uVar7 = 0x40;
    }
    else {
      lVar1 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar7 = (uint)lVar1 ^ 0x3f;
    }
    iVar9 = 0x32 - uVar7;
    if (0x32 < uVar7) {
      iVar9 = 0;
    }
    bVar6 = 0xc;
    if (0x4000 < sVar2) {
      bVar6 = (char)iVar9 + 0xb;
    }
    uVar7 = ((uint)(uVar8 >> (bVar6 & 0x3f)) & 3) + iVar9 * 4;
  }
  else {
    uVar7 = 199;
  }
  uVar3 = (ulong)(uVar7 >> 6);
  uVar8 = (psset->pageslab_bitmap[uVar3] >> ((byte)uVar7 & 0x3f)) << ((byte)uVar7 & 0x3f);
  if (uVar8 == 0) {
    uVar4 = 0x40;
    do {
      if (uVar3 == 0) goto LAB_00cfc67f;
      uVar8 = psset->pageslab_bitmap[uVar3 + 1];
      uVar3 = uVar3 + 1;
    } while (uVar8 == 0);
  }
  uVar4 = 0;
  if (uVar8 != 0) {
    for (; (uVar8 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
    }
  }
  uVar4 = (uint)((int)uVar3 << 6) | uVar4;
LAB_00cfc67f:
  if ((int)uVar4 == 0x40) {
    return (psset->empty).head.qlh_first;
  }
  phVar5 = duckdb_je_hpdata_age_heap_first(psset->pageslabs + uVar4);
  return phVar5;
}

Assistant:

hpdata_t *
psset_pick_alloc(psset_t *psset, size_t size) {
	assert((size & PAGE_MASK) == 0);
	assert(size <= HUGEPAGE);

	pszind_t min_pind = sz_psz2ind(sz_psz_quantize_ceil(size));
	pszind_t pind = (pszind_t)fb_ffs(psset->pageslab_bitmap, PSSET_NPSIZES,
	    (size_t)min_pind);
	if (pind == PSSET_NPSIZES) {
		return hpdata_empty_list_first(&psset->empty);
	}
	hpdata_t *ps = hpdata_age_heap_first(&psset->pageslabs[pind]);
	if (ps == NULL) {
		return NULL;
	}

	hpdata_assert_consistent(ps);

	return ps;
}